

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobIOSystem.h
# Opt level: O2

aiExportDataBlob * __thiscall Assimp::BlobIOStream::GetBlob(BlobIOStream *this)

{
  aiExportDataBlob *paVar1;
  
  paVar1 = (aiExportDataBlob *)operator_new(0x420);
  (paVar1->name).length = 0;
  (paVar1->name).data[0] = '\0';
  memset((paVar1->name).data + 1,0x1b,0x3ff);
  paVar1->next = (aiExportDataBlob *)0x0;
  paVar1->size = this->file_size;
  paVar1->data = this->buffer;
  this->buffer = (uint8_t *)0x0;
  return paVar1;
}

Assistant:

aiExportDataBlob* GetBlob()
    {
        aiExportDataBlob* blob = new aiExportDataBlob();
        blob->size = file_size;
        blob->data = buffer;

        buffer = NULL;

        return blob;
    }